

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSat.c
# Opt level: O1

Abc_Cex_t * Saig_RefManReason2Cex(Saig_RefMan_t *p,Vec_Int_t *vReasons)

{
  uint uVar1;
  int *piVar2;
  int *piVar3;
  Abc_Cex_t *pAVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  
  pAVar4 = Abc_CexDup(p->pCex,p->pCex->nRegs);
  memset(pAVar4 + 1,0,
         (long)(int)(((pAVar4->nBits >> 5) + 1) - (uint)((pAVar4->nBits & 0x1fU) == 0)) << 2);
  if (0 < vReasons->nSize) {
    piVar2 = vReasons->pArray;
    lVar6 = 0;
    do {
      uVar1 = piVar2[lVar6];
      if (((int)uVar1 < 0) || (p->pFrames->nObjs[2] <= (int)uVar1)) {
        __assert_fail("Entry >= 0 && Entry < Aig_ManCiNum(p->pFrames)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absOldSat.c"
                      ,0x65,"Abc_Cex_t *Saig_RefManReason2Cex(Saig_RefMan_t *, Vec_Int_t *)");
      }
      iVar5 = p->vMapPiF2A->nSize;
      if ((iVar5 <= (int)(uVar1 * 2)) || (uVar7 = uVar1 * 2 | 1, iVar5 <= (int)uVar7)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar3 = p->vMapPiF2A->pArray;
      iVar5 = pAVar4->nRegs + piVar3[(ulong)uVar1 * 2] + pAVar4->nPis * piVar3[uVar7];
      (&pAVar4[1].iPo)[iVar5 >> 5] = (&pAVar4[1].iPo)[iVar5 >> 5] | 1 << ((byte)iVar5 & 0x1f);
      lVar6 = lVar6 + 1;
    } while (lVar6 < vReasons->nSize);
  }
  return pAVar4;
}

Assistant:

Abc_Cex_t * Saig_RefManReason2Cex( Saig_RefMan_t * p, Vec_Int_t * vReasons )
{
    Abc_Cex_t * pCare;
    int i, Entry, iInput, iFrame;
    pCare = Abc_CexDup( p->pCex, p->pCex->nRegs );
    memset( pCare->pData, 0, sizeof(unsigned) * Abc_BitWordNum(pCare->nBits) );
    Vec_IntForEachEntry( vReasons, Entry, i )
    {
        assert( Entry >= 0 && Entry < Aig_ManCiNum(p->pFrames) );
        iInput = Vec_IntEntry( p->vMapPiF2A, 2*Entry );
        iFrame = Vec_IntEntry( p->vMapPiF2A, 2*Entry+1 );
        Abc_InfoSetBit( pCare->pData, pCare->nRegs + pCare->nPis * iFrame + iInput );
    }
    return pCare;
}